

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>,boost::use_default,boost::use_default,boost::use_default,boost::use_default>>,std::vector<int,std::allocator<int>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<const_std::_List_const_iterator<int>_*,_std::vector<std::_List_const_iterator<int>,_std::allocator<std::_List_const_iterator<int>_>_>_>,_boost::use_default,_boost::use_default,_boost::use_default,_boost::use_default>_>
          *lhs,char *op,vector<int,_std::allocator<int>_> *rhs)

{
  vector<int,_std::allocator<int>_> *in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<boost::iterator_range<boost::iterators::indirect_iterator<__gnu_cxx::__normal_iterator<std::_List_const_iterator<int>const*,std::vector<std::_List_const_iterator<int>,std::allocator<std::_List_const_iterator<int>>>>,boost::use_default,boost::use_default,boost::use_default,boost::use_default>>>
            (&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  doctest::operator+(&local_30,&local_48,&local_60);
  toStream<std::vector<int,std::allocator<int>>>(&SStack_78,(detail *)op,in);
  doctest::operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }